

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageDref
          (ValidationState_t *_,Instruction *inst,ImageTypeInfo *info)

{
  bool bVar1;
  uint32_t uVar2;
  spv_result_t sVar3;
  string local_218;
  DiagnosticStream local_1f8;
  
  uVar2 = ValidationState_t::GetOperandTypeId(_,inst,4);
  bVar1 = ValidationState_t::IsFloatScalarType(_,uVar2);
  if ((bVar1) && (uVar2 = ValidationState_t::GetBitWidth(_,uVar2), uVar2 == 0x20)) {
    bVar1 = spvIsVulkanEnv(_->context_->target_env);
    if (!bVar1) {
      return SPV_SUCCESS;
    }
    if (info->dim != Dim3D) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    ValidationState_t::VkErrorID_abi_cxx11_(&local_218,_,0x12a9,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,local_218._M_dataplus._M_p,local_218._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,
               "In Vulkan, OpImage*Dref* instructions must not use images with a 3D Dim",0x47);
    sVar3 = local_1f8.error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    ValidationState_t::diag(&local_1f8,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1f8,"Expected Dref to be of 32-bit float type",0x28);
    sVar3 = local_1f8.error_;
  }
  DiagnosticStream::~DiagnosticStream(&local_1f8);
  return sVar3;
}

Assistant:

spv_result_t ValidateImageDref(ValidationState_t& _, const Instruction* inst,
                               const ImageTypeInfo& info) {
  const uint32_t dref_type = _.GetOperandTypeId(inst, 4);
  if (!_.IsFloatScalarType(dref_type) || _.GetBitWidth(dref_type) != 32) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Dref to be of 32-bit float type";
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (info.dim == spv::Dim::Dim3D) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4777)
             << "In Vulkan, OpImage*Dref* instructions must not use images "
                "with a 3D Dim";
    }
  }

  return SPV_SUCCESS;
}